

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void text_client_senditup(t_text_client *x)

{
  t_gstub *ptVar1;
  int iVar2;
  t_textbuf *x_00;
  t_template *ptVar3;
  _glist *local_30;
  _array *owner_array;
  t_gstub *gs;
  t_template *template;
  t_textbuf *y;
  t_text_client *x_local;
  
  if (x->tc_sym == (t_symbol *)0x0) {
    if (x->tc_struct != (t_symbol *)0x0) {
      ptVar3 = template_findbyname(x->tc_struct);
      ptVar1 = (x->tc_gp).gp_stub;
      if (ptVar3 == (t_template *)0x0) {
        pd_error(x,"text: couldn\'t find struct %s",x->tc_struct->s_name);
      }
      else {
        iVar2 = gpointer_check(&x->tc_gp,0);
        if (iVar2 == 0) {
          pd_error(x,"text: stale or empty pointer");
        }
        else if (ptVar1->gs_which == 1) {
          scalar_redraw((x->tc_gp).gp_un.gp_scalar,(ptVar1->gs_un).gs_glist);
        }
        else {
          local_30 = (ptVar1->gs_un).gs_glist;
          while (*(int *)&local_30->gl_list->g_next == 2) {
            local_30 = (_glist *)local_30->gl_list->g_pd;
          }
          scalar_redraw((t_scalar *)(local_30->gl_obj).te_inlet,(_glist *)local_30->gl_list->g_pd);
        }
      }
    }
  }
  else {
    x_00 = (t_textbuf *)pd_findbyclass(x->tc_sym,text_define_class);
    if (x_00 == (t_textbuf *)0x0) {
      bug("text_client_senditup");
    }
    else {
      textbuf_senditup(x_00);
    }
  }
  return;
}

Assistant:

static  void text_client_senditup(t_text_client *x)
{
    if (x->tc_sym)       /* named text object */
    {
        t_textbuf *y = (t_textbuf *)pd_findbyclass(x->tc_sym,
            text_define_class);
        if (y)
            textbuf_senditup(y);
        else bug("text_client_senditup");
    }
    else if (x->tc_struct)   /* by pointer */
    {
        t_template *template = template_findbyname(x->tc_struct);
        t_gstub *gs = x->tc_gp.gp_stub;
        if (!template)
        {
            pd_error(x, "text: couldn't find struct %s", x->tc_struct->s_name);
            return;
        }
        if (!gpointer_check(&x->tc_gp, 0))
        {
            pd_error(x, "text: stale or empty pointer");
            return;
        }
        if (gs->gs_which == GP_GLIST)
            scalar_redraw(x->tc_gp.gp_un.gp_scalar, gs->gs_un.gs_glist);
        else
        {
            t_array *owner_array = gs->gs_un.gs_array;
            while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
                owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
            scalar_redraw(owner_array->a_gp.gp_un.gp_scalar,
                owner_array->a_gp.gp_stub->gs_un.gs_glist);
        }
    }
}